

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

base_learner * CSOAA::csldf_setup(options_i *options,vw *all)

{
  v_array<v_hashmap<unsigned_long,_features>::hash_elem> *this;
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  vw *all_00;
  ulong uVar4;
  int iVar5;
  ldf *dat;
  pointer pcVar6;
  ulong *puVar7;
  vw_exception *pvVar8;
  base_learner *l;
  single_learner *base;
  learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar9;
  long lVar10;
  bool bVar11;
  bool *pbVar12;
  undefined **ppuVar13;
  label_parser *plVar14;
  prediction_type_t pred_type;
  byte bVar15;
  string ldf_arg;
  option_group_definition csldf_inner_options;
  size_type __dnew_6;
  option_group_definition csldf_outer_options;
  string wap_ldf;
  string ldf_override;
  string csoaa_ldf;
  size_type __dnew;
  ulong *local_710;
  ulong local_708;
  ulong local_700 [2];
  option_group_definition local_6f0;
  bool *local_6b8;
  bool *local_6b0;
  _func_int ***local_6a8;
  _func_int **local_6a0;
  _func_int **local_698 [2];
  _func_int ***local_688;
  _func_int **local_680;
  _func_int **local_678 [2];
  v_array<v_hashmap<unsigned_long,_features>::hash_elem> *local_668;
  vw *local_660;
  ulong local_658;
  option_group_definition local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  undefined1 local_5b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0;
  string local_588 [64];
  bool local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_530;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_520;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  typed_option<bool> local_2b0;
  typed_option<bool> local_210;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  
  bVar15 = 0;
  dat = calloc_or_throw<CSOAA::ldf>(1);
  this = &(dat->label_features).dat;
  memset(dat,0,0x118);
  v_array<v_hashmap<unsigned_long,_features>::hash_elem>::resize(this,0x3ff);
  (dat->label_features).eq_data = (void *)0x0;
  (dat->label_features).last_position = 0;
  (dat->label_features).num_occupants = 0;
  (dat->label_features).equivalent = (_func_bool_void_ptr_unsigned_long_ptr_unsigned_long_ptr *)0x0;
  (dat->label_features).equivalent_no_data = (_func_bool_unsigned_long_ptr_unsigned_long_ptr *)0x0;
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  local_5d8._M_string_length = 0;
  local_5d8.field_2._M_local_buf[0] = '\0';
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  local_5f8._M_string_length = 0;
  local_5f8.field_2._M_local_buf[0] = '\0';
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  local_618._M_string_length = 0;
  local_618.field_2._M_local_buf[0] = '\0';
  local_5b8._0_8_ = (_func_int **)0x3c;
  local_688 = local_678;
  local_688 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_688,(ulong)local_5b8);
  local_678[0] = (_func_int **)local_5b8._0_8_;
  builtin_strncpy((char *)((long)local_688 + 0x2c),"pendent ",8);
  builtin_strncpy((char *)((long)local_688 + 0x34),"Features",8);
  local_688[4] = (_func_int **)0x6562614c20687469;
  local_688[5] = (_func_int **)0x646e65706544206c;
  local_688[2] = (_func_int **)0x6e6961674120656e;
  local_688[3] = (_func_int **)0x77206c6c41207473;
  *(undefined4 *)local_688 = 0x74736f43;
  builtin_strncpy((char *)((long)local_688 + 4)," Sen",4);
  *(undefined4 *)(local_688 + 1) = 0x69746973;
  builtin_strncpy((char *)((long)local_688 + 0xc),"ve O",4);
  local_680 = (_func_int **)local_5b8._0_8_;
  *(char *)((long)local_688 + local_5b8._0_8_) = '\0';
  local_650.m_name._M_dataplus._M_p = (pointer)&local_650.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_650,local_688,(char *)(local_5b8._0_8_ + (long)local_688));
  local_650.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_650.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_650.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_688 != local_678) {
    operator_delete(local_688);
  }
  local_3b0.field_2._M_allocated_capacity = 0x646c5f61616f7363;
  local_3b0.field_2._8_2_ = 0x66;
  local_3b0._M_string_length = 9;
  local_668 = this;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b8,&local_3b0,&local_5d8);
  local_548 = true;
  local_6f0.m_name._M_dataplus._M_p = (pointer)&local_6f0.m_name.field_2;
  local_710 = (ulong *)0x46;
  local_660 = all;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_6f0,(ulong)&local_710);
  puVar7 = local_710;
  local_6f0.m_name.field_2._M_allocated_capacity = (size_type)local_710;
  local_6f0.m_name._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,"Use one-against-all multiclass learning with label dependent features.",0x46);
  local_6f0.m_name._M_string_length = (size_type)puVar7;
  pcVar6[(long)puVar7] = '\0';
  std::__cxx11::string::_M_assign(local_588);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b8);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_650,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd158;
  if (local_d0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0.m_name._M_dataplus._M_p != &local_6f0.m_name.field_2) {
    operator_delete(local_6f0.m_name._M_dataplus._M_p);
  }
  local_5b8._0_8_ = &PTR__typed_option_002cd158;
  if (local_520._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_520._M_pi);
  }
  if (local_530._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_530._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  local_3d0.field_2._M_allocated_capacity = 0x7265766f5f66646c;
  local_3d0.field_2._8_4_ = 0x65646972;
  local_3d0._M_string_length = 0xc;
  local_3d0.field_2._M_local_buf[0xc] = '\0';
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b8,&local_3d0,&local_5f8);
  local_6f0.m_name._M_dataplus._M_p = (pointer)&local_6f0.m_name.field_2;
  local_710 = (ulong *)0x50;
  pcVar6 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_6f0,(ulong)&local_710);
  puVar7 = local_710;
  local_6f0.m_name.field_2._M_allocated_capacity = (size_type)local_710;
  local_6f0.m_name._M_dataplus._M_p = pcVar6;
  memcpy(pcVar6,"Override singleline or multiline from csoaa_ldf or wap_ldf, eg if stored in file",
         0x50);
  local_6f0.m_name._M_string_length = (size_type)puVar7;
  pcVar6[(long)puVar7] = '\0';
  std::__cxx11::string::_M_assign(local_588);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_170,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b8);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_650,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd158;
  if (local_170.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_170.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0.m_name._M_dataplus._M_p != &local_6f0.m_name.field_2) {
    operator_delete(local_6f0.m_name._M_dataplus._M_p);
  }
  local_5b8._0_8_ = &PTR__typed_option_002cd158;
  if (local_520._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_520._M_pi);
  }
  if (local_530._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_530._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  local_3f0.field_2._M_allocated_capacity = 0x61725f61616f7363;
  local_3f0.field_2._8_2_ = 0x6b6e;
  local_3f0._M_string_length = 10;
  local_3f0.field_2._M_local_buf[10] = '\0';
  local_6b0 = &dat->rank;
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_5b8,&local_3f0,local_6b0)
  ;
  local_548 = true;
  local_6f0.m_name._M_dataplus._M_p = (pointer)&local_6f0.m_name.field_2;
  local_710 = (ulong *)0x24;
  local_6f0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_6f0,(ulong)&local_710);
  local_6f0.m_name.field_2._M_allocated_capacity = (size_type)local_710;
  builtin_strncpy(local_6f0.m_name._M_dataplus._M_p,"Return actions sorted by score order",0x24);
  local_6f0.m_name._M_string_length = (size_type)local_710;
  local_6f0.m_name._M_dataplus._M_p[(long)local_710] = '\0';
  std::__cxx11::string::_M_assign(local_588);
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_5b8);
  VW::config::option_group_definition::add<bool>(&local_650,&local_210);
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0f0;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0.m_name._M_dataplus._M_p != &local_6f0.m_name.field_2) {
    operator_delete(local_6f0.m_name._M_dataplus._M_p);
  }
  local_5b8._0_8_ = &PTR__typed_option_002cd0f0;
  if (local_520._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_520._M_pi);
  }
  if (local_530._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_530._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_410.field_2._M_allocated_capacity._0_5_ = 0x61626f7270;
  local_410.field_2._M_allocated_capacity._5_3_ = 0x6c6962;
  local_410.field_2._8_5_ = 0x7365697469;
  local_410._M_string_length = 0xd;
  local_410.field_2._M_local_buf[0xd] = '\0';
  pbVar12 = &dat->is_probabilities;
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_5b8,&local_410,pbVar12);
  local_548 = true;
  local_6f0.m_name._M_dataplus._M_p = (pointer)&local_6f0.m_name.field_2;
  local_710 = (ulong *)0x23;
  local_6f0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_6f0,(ulong)&local_710);
  local_6f0.m_name.field_2._M_allocated_capacity = (size_type)local_710;
  builtin_strncpy(local_6f0.m_name._M_dataplus._M_p,"predict probabilites of all classes",0x23);
  local_6f0.m_name._M_string_length = (size_type)local_710;
  local_6f0.m_name._M_dataplus._M_p[(long)local_710] = '\0';
  std::__cxx11::string::_M_assign(local_588);
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_5b8);
  VW::config::option_group_definition::add<bool>(&local_650,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0f0;
  if (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0.m_name._M_dataplus._M_p != &local_6f0.m_name.field_2) {
    operator_delete(local_6f0.m_name._M_dataplus._M_p);
  }
  local_5b8._0_8_ = &PTR__typed_option_002cd0f0;
  if (local_520._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_520._M_pi);
  }
  if (local_530._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_530._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  local_5b8._0_8_ = (_func_int **)0x3c;
  local_6a8 = local_698;
  local_6a8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_6a8,(ulong)local_5b8);
  local_698[0] = (_func_int **)local_5b8._0_8_;
  builtin_strncpy((char *)((long)local_6a8 + 0x2c),"pendent ",8);
  builtin_strncpy((char *)((long)local_6a8 + 0x34),"Features",8);
  local_6a8[4] = (_func_int **)0x6562614c20687469;
  local_6a8[5] = (_func_int **)0x646e65706544206c;
  local_6a8[2] = (_func_int **)0x6e6961674120656e;
  local_6a8[3] = (_func_int **)0x77206c6c41207473;
  *(undefined4 *)local_6a8 = 0x74736f43;
  builtin_strncpy((char *)((long)local_6a8 + 4)," Sen",4);
  *(undefined4 *)(local_6a8 + 1) = 0x69746973;
  builtin_strncpy((char *)((long)local_6a8 + 0xc),"ve O",4);
  local_6a0 = (_func_int **)local_5b8._0_8_;
  *(char *)((long)local_6a8 + local_5b8._0_8_) = '\0';
  local_6f0.m_name._M_dataplus._M_p = (pointer)&local_6f0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6f0,local_6a8,(char *)(local_5b8._0_8_ + (long)local_6a8));
  local_6f0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6f0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6f0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6b8 = pbVar12;
  if (local_6a8 != local_698) {
    operator_delete(local_6a8);
  }
  local_430.field_2._M_allocated_capacity._0_4_ = 0x5f706177;
  local_430.field_2._M_allocated_capacity._4_3_ = 0x66646c;
  local_430._M_string_length = 7;
  local_430.field_2._M_local_buf[7] = '\0';
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b8,&local_430,&local_618);
  local_548 = true;
  local_710 = local_700;
  local_658 = 0x6b;
  puVar7 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_710,(ulong)&local_658);
  uVar4 = local_658;
  local_700[0] = local_658;
  local_710 = puVar7;
  memcpy(puVar7,
         "Use weighted all-pairs multiclass learning with label dependent features.  Specify singleline or multiline."
         ,0x6b);
  local_708 = uVar4;
  *(undefined1 *)((long)puVar7 + uVar4) = 0;
  std::__cxx11::string::_M_assign(local_588);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_350,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b8);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_6f0,&local_350);
  all_00 = local_660;
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd158;
  if (local_350.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_350.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_710 != local_700) {
    operator_delete(local_710);
  }
  local_5b8._0_8_ = &PTR__typed_option_002cd158;
  if (local_520._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_520._M_pi);
  }
  if (local_530._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_530._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_650);
  pp_Var2 = (_func_int **)(local_5b8 + 0x10);
  local_5b8._16_8_ = 0x646c5f61616f7363;
  local_5a0._M_allocated_capacity._0_2_ = 0x66;
  local_5b8._8_8_ = (pointer)0x9;
  local_5b8._0_8_ = pp_Var2;
  iVar5 = (*options->_vptr_options_i[1])(options,local_5b8);
  if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
    operator_delete((void *)local_5b8._0_8_);
  }
  if ((char)iVar5 == '\0') {
    (**options->_vptr_options_i)(options,&local_6f0);
    local_5b8._8_8_ = (pointer)0x7;
    local_5b8._16_8_ = 0x66646c5f706177;
    local_5b8._0_8_ = pp_Var2;
    iVar5 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
      operator_delete((void *)local_5b8._0_8_);
    }
    if ((char)iVar5 == '\0') {
      plVar9 = (learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
      goto LAB_00244760;
    }
  }
  dat->all = all_00;
  dat->first_pass = true;
  local_710 = local_700;
  local_708 = 0;
  local_700[0] = local_700[0] & 0xffffffffffffff00;
  local_5b8._16_8_ = 0x646c5f61616f7363;
  local_5a0._M_allocated_capacity._0_2_ = 0x66;
  local_5b8._8_8_ = (pointer)0x9;
  local_5b8._0_8_ = pp_Var2;
  iVar5 = (*options->_vptr_options_i[1])(options);
  if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
    operator_delete((void *)local_5b8._0_8_);
  }
  if ((char)iVar5 == '\0') {
    std::__cxx11::string::_M_assign((string *)&local_710);
    dat->is_wap = true;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_710);
  }
  local_5b8._16_8_ = 0x7265766f5f66646c;
  local_5a0._M_allocated_capacity._0_4_ = 0x65646972;
  local_5b8._8_8_ = (pointer)0xc;
  local_5a0._M_local_buf[4] = '\0';
  local_5b8._0_8_ = pp_Var2;
  iVar5 = (*options->_vptr_options_i[1])(options);
  if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
    operator_delete((void *)local_5b8._0_8_);
  }
  if ((char)iVar5 != '\0') {
    std::__cxx11::string::_M_assign((string *)&local_710);
  }
  if (*local_6b0 == true) {
    all_00->delete_prediction = ACTION_SCORE::delete_action_scores;
  }
  ppuVar13 = &COST_SENSITIVE::cs_label;
  plVar14 = &all_00->p->lp;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    plVar14->default_label = (_func_void_void_ptr *)*ppuVar13;
    ppuVar13 = ppuVar13 + (ulong)bVar15 * -2 + 1;
    plVar14 = (label_parser *)((long)plVar14 + (ulong)bVar15 * -0x10 + 8);
  }
  all_00->label_type = cs;
  dat->treat_as_classifier = false;
  iVar5 = std::__cxx11::string::compare((char *)&local_710);
  if (iVar5 == 0) {
LAB_00244525:
    bVar11 = false;
LAB_00244527:
    dat->treat_as_classifier = bVar11;
    pbVar12 = local_6b8;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_710);
    if (iVar5 == 0) goto LAB_00244525;
    iVar5 = std::__cxx11::string::compare((char *)&local_710);
    bVar11 = true;
    if (iVar5 == 0) goto LAB_00244527;
    iVar5 = std::__cxx11::string::compare((char *)&local_710);
    if (iVar5 == 0) goto LAB_00244527;
    if (all_00->training == true) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_5b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_5b8 + 0x10),
                 "ldf requires either m/multiline or mc/multiline-classifier",0x3a);
      pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
                 ,0x376,&local_370);
      __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_710);
    pbVar12 = local_6b8;
    if (iVar5 == 0) {
LAB_002444a1:
      std::__cxx11::stringstream::stringstream((stringstream *)local_5b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_5b8 + 0x10),
                 "ldf requires either m/multiline or mc/multiline-classifier.  s/sc/singleline/singleline-classifier is no longer supported"
                 ,0x79);
      pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
                 ,0x37b,&local_390);
      __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_710);
    if (iVar5 == 0) goto LAB_002444a1;
    iVar5 = std::__cxx11::string::compare((char *)&local_710);
    if (iVar5 == 0) goto LAB_002444a1;
    iVar5 = std::__cxx11::string::compare((char *)&local_710);
    if (iVar5 == 0) goto LAB_002444a1;
  }
  if (*pbVar12 == true) {
    all_00->sd->report_multiclass_log_loss = true;
    (**all_00->loss->_vptr_loss_function)(local_5b8);
    iVar5 = std::__cxx11::string::compare(local_5b8);
    if (iVar5 != 0) {
      pvVar1 = &all_00->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,
                 "WARNING: --probabilities should be used only with --loss_function=logistic",0x4a);
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
      std::ostream::put((char)pvVar1);
      std::ostream::flush();
    }
    if (dat->treat_as_classifier == false) {
      pvVar1 = &all_00->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,
                 "WARNING: --probabilities should be used with --csoaa_ldf=mc (or --oaa)",0x46);
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
      std::ostream::put((char)pvVar1);
      std::ostream::flush();
    }
    if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
      operator_delete((void *)local_5b8._0_8_);
    }
  }
  all_00->p->emptylines_separate_examples = true;
  v_array<v_hashmap<unsigned_long,_features>::hash_elem>::resize(local_668,0x3ff);
  (dat->label_features).equivalent = (_func_bool_void_ptr_unsigned_long_ptr_unsigned_long_ptr *)0x0;
  (dat->label_features).default_value.values._begin = (float *)0x0;
  (dat->label_features).default_value.values._end = (float *)0x0;
  (dat->label_features).default_value.values.end_array = (float *)0x0;
  (dat->label_features).default_value.values.erase_count = 0;
  (dat->label_features).default_value.indicies._begin = (unsigned_long *)0x0;
  (dat->label_features).default_value.indicies._end = (unsigned_long *)0x0;
  (dat->label_features).default_value.indicies.end_array = (unsigned_long *)0x0;
  (dat->label_features).default_value.indicies.erase_count = 0;
  (dat->label_features).default_value.space_names._begin =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  (dat->label_features).default_value.space_names._end =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  (dat->label_features).default_value.space_names.end_array =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  (dat->label_features).default_value.space_names.erase_count = 0;
  (dat->label_features).default_value.sum_feat_sq = 0.0;
  (dat->label_features).equivalent_no_data = LabelDict::size_t_eq;
  (dat->label_features).eq_data = (void *)0x0;
  (dat->label_features).last_position = 0;
  (dat->label_features).num_occupants = 0;
  local_5b8._0_8_ = (_func_int **)0x1;
  v_hashmap<unsigned_long,_features>::get(&dat->label_features,(unsigned_long *)local_5b8,0x5a5453c)
  ;
  pred_type = action_scores;
  if (*local_6b0 == false) {
    pred_type = (uint)*pbVar12 * 2 + multiclass;
  }
  dat->read_example_this_loop = 0;
  l = setup_base(all_00->options,all_00);
  base = LEARNER::as_singleline<char,char>(l);
  plVar9 = LEARNER::learner<CSOAA::ldf,std::vector<example*,std::allocator<example*>>>::
           init_learner<LEARNER::learner<char,example>>
                     (dat,base,do_actual_learning<true>,do_actual_learning<false>,1,pred_type);
  uVar3 = *(undefined8 *)(plVar9 + 0x18);
  *(undefined8 *)(plVar9 + 0x58) = uVar3;
  *(code **)(plVar9 + 0x68) = finish_multiline_example;
  *(undefined8 *)(plVar9 + 0xb8) = uVar3;
  *(undefined8 *)(plVar9 + 0xc0) = *(undefined8 *)(plVar9 + 0x20);
  *(code **)(plVar9 + 200) = finish;
  *(undefined8 *)(plVar9 + 0x88) = uVar3;
  *(undefined8 *)(plVar9 + 0x90) = *(undefined8 *)(plVar9 + 0x20);
  *(code **)(plVar9 + 0x98) = end_pass;
  all_00->cost_sensitive = (base_learner *)plVar9;
  if (local_710 != local_700) {
    operator_delete(local_710);
  }
  dat = (ldf *)0x0;
LAB_00244760:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_6f0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0.m_name._M_dataplus._M_p != &local_6f0.m_name.field_2) {
    operator_delete(local_6f0.m_name._M_dataplus._M_p);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_650.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.m_name._M_dataplus._M_p != &local_650.m_name.field_2) {
    operator_delete(local_650.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p);
  }
  if (dat != (ldf *)0x0) {
    destroy_free<CSOAA::ldf>(dat);
  }
  return (base_learner *)plVar9;
}

Assistant:

base_learner* csldf_setup(options_i& options, vw& all)
{
  auto ld = scoped_calloc_or_throw<ldf>();

  std::string csoaa_ldf;
  std::string ldf_override;
  std::string wap_ldf;

  option_group_definition csldf_outer_options("Cost Sensitive One Against All with Label Dependent Features");
  csldf_outer_options.add(make_option("csoaa_ldf", csoaa_ldf)
                              .keep()
                              .help("Use one-against-all multiclass learning with label dependent features."));
  csldf_outer_options.add(
      make_option("ldf_override", ldf_override)
          .help("Override singleline or multiline from csoaa_ldf or wap_ldf, eg if stored in file"));
  csldf_outer_options.add(make_option("csoaa_rank", ld->rank).keep().help("Return actions sorted by score order"));
  csldf_outer_options.add(
      make_option("probabilities", ld->is_probabilities).keep().help("predict probabilites of all classes"));

  option_group_definition csldf_inner_options("Cost Sensitive One Against All with Label Dependent Features");
  csldf_inner_options.add(make_option("wap_ldf", wap_ldf)
                              .keep()
                              .help("Use weighted all-pairs multiclass learning with label dependent features.  "
                                    "Specify singleline or multiline."));

  options.add_and_parse(csldf_outer_options);
  if (!options.was_supplied("csoaa_ldf"))
  {
    options.add_and_parse(csldf_inner_options);
    if (!options.was_supplied("wap_ldf"))
    {
      return nullptr;
    }
  }

  ld->all = &all;
  ld->first_pass = true;

  string ldf_arg;

  if (options.was_supplied("csoaa_ldf"))
    ldf_arg = csoaa_ldf;
  else
  {
    ldf_arg = wap_ldf;
    ld->is_wap = true;
  }
  if (options.was_supplied("ldf_override"))
    ldf_arg = ldf_override;
  if (ld->rank)
    all.delete_prediction = delete_action_scores;

  all.p->lp = COST_SENSITIVE::cs_label;
  all.label_type = label_type::cs;

  ld->treat_as_classifier = false;
  if (ldf_arg.compare("multiline") == 0 || ldf_arg.compare("m") == 0)
    ld->treat_as_classifier = false;
  else if (ldf_arg.compare("multiline-classifier") == 0 || ldf_arg.compare("mc") == 0)
    ld->treat_as_classifier = true;
  else
  {
    if (all.training)
      THROW("ldf requires either m/multiline or mc/multiline-classifier");
    if ((ldf_arg.compare("singleline") == 0 || ldf_arg.compare("s") == 0) ||
        (ldf_arg.compare("singleline-classifier") == 0 || ldf_arg.compare("sc") == 0))
      THROW(
          "ldf requires either m/multiline or mc/multiline-classifier.  s/sc/singleline/singleline-classifier is no "
          "longer supported");
  }

  if (ld->is_probabilities)
  {
    all.sd->report_multiclass_log_loss = true;
    auto loss_function_type = all.loss->getType();
    if (loss_function_type != "logistic")
      all.trace_message << "WARNING: --probabilities should be used only with --loss_function=logistic" << endl;
    if (!ld->treat_as_classifier)
      all.trace_message << "WARNING: --probabilities should be used with --csoaa_ldf=mc (or --oaa)" << endl;
  }

  all.p->emptylines_separate_examples = true;  // TODO: check this to be sure!!!  !ld->is_singleline;

  features fs;
  ld->label_features.init(256, fs, LabelDict::size_t_eq);
  ld->label_features.get(1, 94717244);  // TODO: figure this out
  prediction_type::prediction_type_t pred_type;

  if (ld->rank)
    pred_type = prediction_type::action_scores;
  else if (ld->is_probabilities)
    pred_type = prediction_type::prob;
  else
    pred_type = prediction_type::multiclass;

  ld->read_example_this_loop = 0;
  learner<ldf, multi_ex>& l = init_learner(ld, as_singleline(setup_base(*all.options, all)), do_actual_learning<true>,
      do_actual_learning<false>, 1, pred_type);
  l.set_finish_example(finish_multiline_example);
  l.set_finish(finish);
  l.set_end_pass(end_pass);
  all.cost_sensitive = make_base(l);
  return all.cost_sensitive;
}